

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O3

void nn_btcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  nn_list_item *it;
  
  if (*(int *)&self[1].ctx == 2) {
    if (src == 1) {
      if (0xfffffffd < type - 9U) {
        return;
      }
      goto LAB_00129cf4;
    }
    if (src == 3) {
      srcptr = self;
      if (type == 1) {
LAB_00129cdb:
        nn_free(srcptr);
        return;
      }
      goto LAB_00129cef;
    }
    if (src != 2) goto LAB_00129cf9;
    if (type == 0x85b9) {
      nn_list_erase((nn_list *)&self[8].stopped.src,(nn_list_item *)((long)srcptr + 0x720));
      nn_atcp_term((nn_atcp *)srcptr);
      goto LAB_00129cdb;
    }
    if (type == 0x85b8) {
      nn_atcp_stop((nn_atcp *)srcptr);
      return;
    }
    if (type != 0x85b7) goto LAB_00129d08;
    if (self[8].stopped.fsm == (nn_fsm *)srcptr) {
      self_00 = &self[8].stopped.src;
      it = nn_list_end((nn_list *)self_00);
      nn_list_insert((nn_list *)self_00,(nn_list_item *)((long)srcptr + 0x720),it);
      self[8].stopped.fsm = (nn_fsm *)0x0;
      nn_btcp_start_accepting((nn_btcp *)self);
      return;
    }
LAB_00129cfe:
    nn_btcp_handler_cold_1();
  }
  else if (*(int *)&self[1].ctx == 1) {
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].ctx = 2;
        return;
      }
    }
    else {
      nn_btcp_handler_cold_6();
    }
    nn_btcp_handler_cold_7();
LAB_00129cef:
    nn_btcp_handler_cold_4();
LAB_00129cf4:
    nn_btcp_handler_cold_3();
LAB_00129cf9:
    nn_btcp_handler_cold_5();
    goto LAB_00129cfe;
  }
  nn_btcp_handler_cold_8();
LAB_00129d08:
  nn_btcp_handler_cold_2();
}

Assistant:

static void nn_btcp_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    switch (btcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BTCP_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        btcp->state = NN_BTCP_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the atcp state machine in this state.         */
/******************************************************************************/
    case NN_BTCP_STATE_ACTIVE:
        if (src == NN_BTCP_SRC_BTCP) {   
            nn_assert (type == NN_BTCP_TYPE_LISTEN_ERR);
            nn_free (btcp);
            return;
        }

        if (src == NN_BTCP_SRC_USOCK) {
            /*  usock object cleaning up */
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /*  All other events come from child atcp objects. */
        nn_assert (src == NN_BTCP_SRC_ATCP);
        atcp = (struct nn_atcp*) srcptr;
        switch (type) {
        case NN_ATCP_ACCEPTED:
            nn_assert (btcp->atcp == atcp) ;
            nn_list_insert (&btcp->atcps, &atcp->item,
                nn_list_end (&btcp->atcps));
            btcp->atcp = NULL;
            nn_btcp_start_accepting (btcp);
            return;
        case NN_ATCP_ERROR:
            nn_atcp_stop (atcp);
            return;
        case NN_ATCP_STOPPED:
            nn_list_erase (&btcp->atcps, &atcp->item);
            nn_atcp_term (atcp);
            nn_free (atcp);
            return;
        default:
            nn_fsm_bad_action (btcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (btcp->state, src, type);
    }
}